

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O1

void Abc_NtkUpdateNameIds(Abc_Ntk_t *p)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  FILE *__stream;
  Vec_Int_t *p_00;
  int *piVar7;
  Vec_Ptr_t *pVVar8;
  int Entry;
  ulong uVar9;
  char pFileName [1000];
  char acStack_418 [1000];
  
  if (p->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0x2fb,"void Abc_NtkUpdateNameIds(Abc_Ntk_t *)");
  }
  pcVar5 = p->pSpec;
  sVar4 = strlen(pcVar5);
  if (999 < sVar4) {
    __assert_fail("strlen(p->pSpec) < 1000",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0x2fc,"void Abc_NtkUpdateNameIds(Abc_Ntk_t *)");
  }
  if (p->vNameIds == (Vec_Int_t *)0x0) {
    __assert_fail("p->vNameIds != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0x2fd,"void Abc_NtkUpdateNameIds(Abc_Ntk_t *)");
  }
  pcVar5 = Extra_FileNameGenericAppend(pcVar5,"");
  pcVar6 = Extra_FileNameExtension(p->pSpec);
  sprintf(acStack_418,"%s_%s_names.txt",pcVar5,pcVar6);
  __stream = fopen(acStack_418,"r+");
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(4000);
  p_00->pArray = piVar7;
  Vec_IntPush(p_00,-1);
  iVar3 = fgetc(__stream);
  if (iVar3 != -1) {
    Entry = 1;
    bVar2 = false;
    do {
      if ((iVar3 != 0x20) || (bVar2)) {
        if (iVar3 == 10) {
          bVar2 = false;
        }
      }
      else {
        Vec_IntPush(p_00,Entry);
        bVar2 = true;
      }
      iVar3 = fgetc(__stream);
      Entry = Entry + 1;
    } while (iVar3 != -1);
  }
  pVVar8 = p->vObjs;
  if (0 < pVVar8->nSize) {
    uVar9 = 0;
    do {
      if ((((uVar9 != 0) && (pVVar8->pArray[uVar9] != (void *)0x0)) &&
          ((long)uVar9 < (long)p->vNameIds->nSize)) &&
         (uVar1 = p->vNameIds->pArray[uVar9], uVar1 != 0)) {
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        if (p_00->nSize <= (int)(uVar1 >> 1)) {
          __assert_fail("iVar < Vec_IntSize(vStarts)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                        ,0x310,"void Abc_NtkUpdateNameIds(Abc_Ntk_t *)");
        }
        fseek(__stream,(long)p_00->pArray[uVar1 >> 1],0);
        pcVar5 = "-";
        if ((uVar1 & 1) == 0) {
          pcVar5 = "";
        }
        fprintf(__stream,"%s%d",pcVar5,uVar9 & 0xffffffff);
      }
      uVar9 = uVar9 + 1;
      pVVar8 = p->vObjs;
    } while ((long)uVar9 < (long)pVVar8->nSize);
  }
  printf("Saved %d names into file \"%s\".\n",(ulong)(p_00->nSize - 1),acStack_418);
  fclose(__stream);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (p->vNameIds != (Vec_Int_t *)0x0) {
    piVar7 = p->vNameIds->pArray;
    if (piVar7 != (int *)0x0) {
      free(piVar7);
      p->vNameIds->pArray = (int *)0x0;
    }
    if (p->vNameIds != (Vec_Int_t *)0x0) {
      free(p->vNameIds);
      p->vNameIds = (Vec_Int_t *)0x0;
    }
  }
  return;
}

Assistant:

void Abc_NtkUpdateNameIds( Abc_Ntk_t * p )
{
    char pFileName[1000];
    Vec_Int_t * vStarts;
    Abc_Obj_t * pObj;
    FILE * pFile;
    int i, c, iVar, fCompl, fSeenSpace, Counter = 0;
    assert( !Abc_NtkIsNetlist(p) );
    assert( strlen(p->pSpec) < 1000 );
    assert( p->vNameIds != NULL );
    sprintf( pFileName, "%s_%s_names.txt", Extra_FileNameGenericAppend(p->pSpec,""), Extra_FileNameExtension(p->pSpec) );
    pFile = fopen( pFileName, "r+" );
    // collect info about lines
    fSeenSpace = 0;
    vStarts = Vec_IntAlloc( 1000 );
    Vec_IntPush( vStarts, -1 );
    while ( (c = fgetc(pFile)) != EOF && ++Counter )
        if ( c == ' ' && !fSeenSpace )
            Vec_IntPush(vStarts, Counter), fSeenSpace = 1;
        else if ( c == '\n' )
            fSeenSpace = 0;
    // add info about names
    Abc_NtkForEachObj( p, pObj, i )
    {
        if ( i == 0 || i >= Vec_IntSize(p->vNameIds) || !Vec_IntEntry(p->vNameIds, i) )
            continue;
        iVar = Abc_Lit2Var( Vec_IntEntry(p->vNameIds, i) );
        fCompl = Abc_LitIsCompl( Vec_IntEntry(p->vNameIds, i) );
        assert( iVar < Vec_IntSize(vStarts) );
        fseek( pFile, Vec_IntEntry(vStarts, iVar), SEEK_SET );
        fprintf( pFile, "%s%d", fCompl? "-":"", i );
    }
    printf( "Saved %d names into file \"%s\".\n", Vec_IntSize(vStarts)-1, pFileName );
    fclose( pFile );
    Vec_IntFree( vStarts );
    Vec_IntFreeP( &p->vNameIds );
//    Abc_NtkForEachObj( p, pObj, i )
//        Abc_ObjPrint( stdout, pObj );
}